

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgelement.cpp
# Opt level: O1

void __thiscall
lunasvg::SVGClipPathElement::applyClipMask(SVGClipPathElement *this,SVGRenderState *state)

{
  SVGClipPathElement *this_00;
  bool bVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  float tx;
  float ty;
  float fVar2;
  float fVar3;
  shared_ptr<lunasvg::Canvas> maskImage;
  Transform currentTransform;
  undefined1 local_a0 [16];
  Transform local_90;
  float local_78;
  float fStack_74;
  SVGRenderState local_68;
  
  bVar1 = SVGRenderState::hasCycleReference(state,(SVGElement *)this);
  if (!bVar1) {
    (*(state->m_element->super_SVGNode)._vptr_SVGNode[0xd])();
    local_68._0_16_ = Transform::mapRect(&state->m_currentTransform,(Rect *)&local_90);
    fVar2 = local_68.m_parent._0_4_;
    fVar3 = local_68.m_parent._4_4_;
    Canvas::create((Canvas *)local_a0,(Rect *)&local_68);
    local_68.m_currentTransform.m_matrix.a =
         *(float *)&(this->super_SVGGraphicsElement).m_transform.field_0x1c;
    local_68.m_currentTransform.m_matrix.b =
         *(float *)&(this->super_SVGGraphicsElement).m_transform.field_0x20;
    local_68._0_16_ =
         *(undefined1 (*) [16])
          &(this->super_SVGGraphicsElement).m_transform.super_SVGProperty.field_0xc;
    Transform::operator*(&local_90,&state->m_currentTransform,(Transform *)&local_68);
    if ((this->m_clipPathUnits).super_SVGProperty.field_0x9 == '\x01') {
      (*(state->m_element->super_SVGNode)._vptr_SVGNode[0xb])();
      local_78 = fVar2;
      fStack_74 = fVar3;
      Transform::translate(&local_90,tx,ty);
      Transform::scale(&local_90,local_78,fStack_74);
    }
    if ((plutovg_canvas_t *)local_a0._8_8_ != (plutovg_canvas_t *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(local_a0._8_8_ + 8) = *(int *)(local_a0._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(local_a0._8_8_ + 8) = *(int *)(local_a0._8_8_ + 8) + 1;
      }
    }
    local_68.m_parent = state;
    local_68.m_element = (SVGElement *)this;
    local_68.m_currentTransform.m_matrix.e = local_90.m_matrix.e;
    local_68.m_currentTransform.m_matrix.f = local_90.m_matrix.f;
    local_68.m_mode = Clipping;
    local_68.m_canvas.super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_a0._0_8_;
    local_68.m_canvas.super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_;
    SVGElement::renderChildren((SVGElement *)this,&local_68);
    this_00 = (this->super_SVGGraphicsElement).super_SVGElement.m_clipper;
    if (this_00 != (SVGClipPathElement *)0x0) {
      applyClipMask(this_00,&local_68);
    }
    Canvas::blendCanvas((state->m_canvas).
                        super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        (Canvas *)local_a0._0_8_,Dst_In,1.0);
    if (local_68.m_canvas.super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.m_canvas.super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((plutovg_canvas_t *)local_a0._8_8_ != (plutovg_canvas_t *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_);
    }
  }
  return;
}

Assistant:

void SVGClipPathElement::applyClipMask(SVGRenderState& state) const
{
    if(state.hasCycleReference(this))
        return;
    auto maskImage = Canvas::create(state.currentTransform().mapRect(state.paintBoundingBox()));
    auto currentTransform = state.currentTransform() * localTransform();
    if(m_clipPathUnits.value() == Units::ObjectBoundingBox) {
        auto bbox = state.fillBoundingBox();
        currentTransform.translate(bbox.x, bbox.y);
        currentTransform.scale(bbox.w, bbox.h);
    }

    SVGRenderState newState(this, &state, currentTransform, SVGRenderMode::Clipping, maskImage);
    renderChildren(newState);
    if(clipper()) {
        clipper()->applyClipMask(newState);
    }

    state->blendCanvas(*maskImage, BlendMode::Dst_In, 1.f);
}